

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::GlobalImport::~GlobalImport(GlobalImport *this)

{
  GlobalImport *this_local;
  
  ~GlobalImport(this);
  operator_delete(this,0x98);
  return;
}

Assistant:

explicit GlobalImport(std::string_view name = std::string_view())
      : ImportMixin<ExternalKind::Global>(), global(name) {}